

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher.h
# Opt level: O0

bool __thiscall
cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::scan
          (Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *this)

{
  bool bVar1;
  pointer pCVar2;
  long in_RDI;
  const_iterator item_last;
  const_iterator item_it;
  iterator props_it;
  vector<char32_t,_std::allocator<char32_t>_> *in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  size_type in_stack_ffffffffffffffd8;
  __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
  in_stack_ffffffffffffffe0;
  __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
  local_18 [2];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  std::vector<char32_t,_std::allocator<char32_t>_>::size
            ((vector<char32_t,_std::allocator<char32_t>_> *)(in_RDI + 8));
  std::
  vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
  ::resize((vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
            *)in_stack_ffffffffffffffe0._M_current,in_stack_ffffffffffffffd8);
  local_18[0]._M_current =
       (CharProperties *)
       std::
       vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
       ::begin((vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>
                *)in_stack_ffffffffffffffb8);
  std::vector<char32_t,_std::allocator<char32_t>_>::cbegin(in_stack_ffffffffffffffb8);
  std::vector<char32_t,_std::allocator<char32_t>_>::cend(in_stack_ffffffffffffffb8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                       (__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                        *)in_stack_ffffffffffffffb8);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator*((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
               *)&stack0xffffffffffffffe0);
    in_stack_ffffffffffffffc7 = Utf8StringTraits::is_uppercase(L'\0');
    pCVar2 = __gnu_cxx::
             __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
             ::operator->(local_18);
    pCVar2->uppercase = (bool)(in_stack_ffffffffffffffc7 & 1);
    __gnu_cxx::
    __normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>::
    operator++((__normal_iterator<const_char32_t_*,_std::vector<char32_t,_std::allocator<char32_t>_>_>
                *)&stack0xffffffffffffffe0);
    __gnu_cxx::
    __normal_iterator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties_*,_std::vector<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties,_std::allocator<cpsm::Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits>::CharProperties>_>_>
    ::operator++(local_18);
  }
  if ((*(byte *)(in_RDI + 0xb8) & 1) == 0) {
    bVar1 = scan_match<false>((Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *)
                              CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  else {
    bVar1 = scan_match<true>((Matcher<cpsm::PlatformPathTraits,_cpsm::Utf8StringTraits> *)
                             CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  }
  return bVar1;
}

Assistant:

bool scan() {
    props_.resize(item_.size());
    auto props_it = props_.begin();
    for (auto item_it = item_.cbegin(), item_last = item_.cend();
         item_it != item_last; ++item_it, ++props_it) {
      props_it->uppercase = StringTraits::is_uppercase(*item_it);
    }
    if (case_sensitive_) {
      return scan_match<true>();
    } else {
      return scan_match<false>();
    }
  }